

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::expand
          (DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *this)

{
  int iVar1;
  Entry *__ptr;
  undefined8 uVar2;
  Entry *pEVar3;
  DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  Entry *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  uint uVar5;
  Exception *in_stack_ffffffffffffffd0;
  Entry *pEVar6;
  
  if (0x1c < in_RDI->_capacityIndex) {
    uVar2 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    __cxa_throw(uVar2,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  iVar1 = *(int *)(DHMapTableCapacities + (long)(in_RDI->_capacityIndex + 1) * 4);
  Lib::alloc((size_t)in_RDI);
  __ptr = in_RDI->_entries;
  pEVar6 = in_RDI->_afterLast;
  uVar5 = in_RDI->_timestamp;
  iVar4 = in_RDI->_capacity;
  in_RDI->_timestamp = 1;
  in_RDI->_size = 0;
  in_RDI->_deleted = 0;
  in_RDI->_capacityIndex = in_RDI->_capacityIndex + 1;
  in_RDI->_capacity = iVar1;
  in_RDI->_nextExpansionOccupancy =
       *(int *)(DHMapTableNextExpansions + (long)in_RDI->_capacityIndex * 4);
  pEVar3 = array_new<Lib::DHMap<Kernel::VarSpec,Lib::EmptyStruct,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in_RDI->_entries = pEVar3;
  in_RDI->_afterLast = in_RDI->_entries + in_RDI->_capacity;
  for (local_40 = __ptr; local_40 != pEVar6; local_40 = local_40 + 1) {
    if (((uint)(local_40->field_0)._infoData >> 2 == uVar5) &&
       (((local_40->field_0)._infoData & 1U) == 0)) {
      insert(in_RDI,(local_40->_key)._self._content,*(ulong *)&(local_40->_key).index & 0xffffffff);
    }
  }
  if (iVar4 != 0) {
    Lib::free(__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }